

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3InsertDocsize(int *pRC,Fts3Table *p,u32 *aSz)

{
  sqlite3_stmt *pStmt;
  int iVar1;
  char *zBuf;
  long in_FS_OFFSET;
  sqlite3_stmt *local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*pRC == 0) {
    zBuf = (char *)sqlite3_malloc64((long)p->nColumn * 10);
    if (zBuf == (char *)0x0) {
      iVar1 = 7;
    }
    else {
      local_3c = -0x55555556;
      local_48 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
      fts3EncodeIntArray(p->nColumn,aSz,zBuf,&local_3c);
      iVar1 = fts3SqlStmt(p,0x14,&local_48,(sqlite3_value **)0x0);
      pStmt = local_48;
      if (iVar1 == 0) {
        sqlite3_bind_int64(local_48,1,p->iPrevDocid);
        sqlite3_bind_blob(pStmt,2,zBuf,local_3c,sqlite3_free);
        sqlite3_step(pStmt);
        iVar1 = sqlite3_reset(pStmt);
      }
      else {
        sqlite3_free(zBuf);
      }
    }
    *pRC = iVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts3InsertDocsize(
  int *pRC,                       /* Result code */
  Fts3Table *p,                   /* Table into which to insert */
  u32 *aSz                        /* Sizes of each column, in tokens */
){
  char *pBlob;             /* The BLOB encoding of the document size */
  int nBlob;               /* Number of bytes in the BLOB */
  sqlite3_stmt *pStmt;     /* Statement used to insert the encoding */
  int rc;                  /* Result code from subfunctions */

  if( *pRC ) return;
  pBlob = sqlite3_malloc64( 10*(sqlite3_int64)p->nColumn );
  if( pBlob==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  fts3EncodeIntArray(p->nColumn, aSz, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_DOCSIZE, &pStmt, 0);
  if( rc ){
    sqlite3_free(pBlob);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int64(pStmt, 1, p->iPrevDocid);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, sqlite3_free);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
}